

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O1

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,TypeAliasType *type,string_view overrideName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type *this_00;
  char *__s;
  size_t __len2;
  string downstreamOverrideName;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  __s = overrideName._M_str;
  __len2 = overrideName._M_len;
  paVar1 = &local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)paVar1;
  if (__len2 == 0) {
    if (((this->options).elideScopeNames == false) &&
       ((this->options).anonymousTypeStyle != FriendlyName)) {
      getLexicalPath_abi_cxx11_
                (&local_38,(ast *)(type->super_Type).super_Symbol.parentScope,(Scope *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_38,(type->super_Type).super_Symbol.name._M_str,
                 (type->super_Type).super_Symbol.name._M_len);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&local_58,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0044b4a6;
    }
    __len2 = (type->super_Type).super_Symbol.name._M_len;
    __s = (type->super_Type).super_Symbol.name._M_str;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_58,0,0,__s,__len2);
LAB_0044b4a6:
  if ((this->options).skipTypeDefs == true) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,
               local_58._M_dataplus._M_p,local_58._M_dataplus._M_p + local_58._M_string_length);
  }
  else {
    this_00 = DeclaredType::getType(&type->targetType);
    Symbol::visit<slang::ast::TypePrinter&,std::__cxx11::string&>
              (&this_00->super_Symbol,this,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TypePrinter::visit(const TypeAliasType& type, std::string_view overrideName) {
    std::string downstreamOverrideName;
    if (!overrideName.empty()) {
        downstreamOverrideName = overrideName;
    }
    else if (options.elideScopeNames ||
             options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        downstreamOverrideName = type.name;
    }
    else {
        std::string path = getLexicalPath(type.getParentScope());
        path.append(type.name);
        downstreamOverrideName = path;
    }

    if (options.skipTypeDefs) {
        buffer->append(downstreamOverrideName);
    }
    else {
        type.targetType.getType().visit(*this, downstreamOverrideName);
    }
}